

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O2

void * startThread(void *obj)

{
  ThreadData::runInThread((ThreadData *)obj);
  ThreadData::~ThreadData((ThreadData *)obj);
  operator_delete(obj);
  return (void *)0x0;
}

Assistant:

void* startThread(void* obj) {
  ThreadData* data = static_cast<ThreadData*>(obj);
  data->runInThread();
  delete data;
  return NULL;
}